

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment::~IfcCompositeCurveSegment
          (IfcCompositeCurveSegment *this)

{
  _func_int *p_Var1;
  long *plVar2;
  
  p_Var1 = (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  plVar2 = (long *)((this->SameSense).field_2._M_local_buf + (long)p_Var1);
  plVar2[-0xc] = 0x85aaf0;
  plVar2[3] = 0x85ab68;
  plVar2[-10] = 0x85ab18;
  plVar2[-8] = 0x85ab40;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  plVar2 = *(long **)(&(this->super_IfcGeometricRepresentationItem).field_0x30 + (long)p_Var1);
  if (plVar2 != (long *)(&this->field_0x40 + (long)p_Var1)) {
    operator_delete(plVar2,*(long *)(&this->field_0x40 + (long)p_Var1) + 1);
    return;
  }
  return;
}

Assistant:

IfcCompositeCurveSegment() : Object("IfcCompositeCurveSegment") {}